

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.cpp
# Opt level: O0

void __thiscall tl::StrT<char32_t>::construct(StrT<char32_t> *this,CStrT<char32_t> o)

{
  u32 uVar1;
  char32_t cVar2;
  ulong uVar3;
  char32_t *pcVar4;
  uint local_28;
  u32 i;
  u32 capacity;
  StrT<char32_t> *this_local;
  CStrT<char32_t> o_local;
  
  o_local._0_8_ = o._str;
  this_local._0_4_ = o._size;
  uVar1 = CStrT<char32_t>::size((CStrT<char32_t> *)&this_local);
  this->_size = uVar1;
  uVar1 = calcCapacity(this->_size);
  uVar3 = SUB168(ZEXT416(uVar1) * ZEXT816(4),0);
  if (SUB168(ZEXT416(uVar1) * ZEXT816(4),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pcVar4 = (char32_t *)operator_new__(uVar3);
  this->_str = pcVar4;
  for (local_28 = 0; local_28 < this->_size; local_28 = local_28 + 1) {
    cVar2 = CStrT<char32_t>::operator[]((CStrT<char32_t> *)&this_local,local_28);
    this->_str[local_28] = cVar2;
  }
  this->_str[this->_size] = L'\0';
  return;
}

Assistant:

void StrT<CharT>::construct(CStrT<CharT> o)
{
    _size = o.size();
    const u32 capacity = calcCapacity(_size);
    _str = new CharT[capacity];
    for(u32 i=0; i<_size; i++) {
        _str[i] = o[i];
    }
    _str[_size] = 0;
}